

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_pss.cc
# Opt level: O2

X509_ALGOR * rsa_mgf1_decode(X509_ALGOR *alg)

{
  ASN1_TYPE *pAVar1;
  int iVar2;
  X509_ALGOR *pXVar3;
  uint8_t *p;
  uchar *local_10;
  
  iVar2 = OBJ_obj2nid((ASN1_OBJECT *)alg->algorithm);
  if (((iVar2 == 0x38f) && (pAVar1 = alg->parameter, pAVar1 != (ASN1_TYPE *)0x0)) &&
     (pAVar1->type == 0x10)) {
    local_10 = ((pAVar1->value).asn1_string)->data;
    pXVar3 = d2i_X509_ALGOR((X509_ALGOR **)0x0,&local_10,(long)((pAVar1->value).asn1_string)->length
                           );
  }
  else {
    pXVar3 = (X509_ALGOR *)0x0;
  }
  return (X509_ALGOR *)pXVar3;
}

Assistant:

static X509_ALGOR *rsa_mgf1_decode(const X509_ALGOR *alg) {
  if (OBJ_obj2nid(alg->algorithm) != NID_mgf1 || alg->parameter == NULL ||
      alg->parameter->type != V_ASN1_SEQUENCE) {
    return NULL;
  }

  const uint8_t *p = alg->parameter->value.sequence->data;
  int plen = alg->parameter->value.sequence->length;
  return d2i_X509_ALGOR(NULL, &p, plen);
}